

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

bool __thiscall
kj::ArrayPtr<const_kj::StringPtr>::operator<
          (ArrayPtr<const_kj::StringPtr> *this,ArrayPtr<const_kj::StringPtr> *other)

{
  bool bVar1;
  WiderType<Decay<const_unsigned_long_&>,_Decay<const_unsigned_long_&>_> WVar2;
  ulong uStack_30;
  bool ret;
  size_t i;
  size_t comparisonSize;
  ArrayPtr<const_kj::StringPtr> *other_local;
  ArrayPtr<const_kj::StringPtr> *this_local;
  
  WVar2 = min<unsigned_long_const&,unsigned_long_const&>(&this->size_,&other->size_);
  uStack_30 = 0;
  while( true ) {
    if (WVar2 <= uStack_30) {
      return this->size_ < other->size_;
    }
    bVar1 = StringPtr::operator==(this->ptr + uStack_30,other->ptr + uStack_30);
    if (!bVar1) break;
    uStack_30 = uStack_30 + 1;
  }
  bVar1 = StringPtr::operator<(this->ptr + uStack_30,other->ptr + uStack_30);
  return bVar1;
}

Assistant:

inline constexpr bool operator<(const ArrayPtr& other) const {
    size_t comparisonSize = kj::min(size_, other.size_);
    if constexpr (isSameType<RemoveConst<T>, char>() || isSameType<RemoveConst<T>, unsigned char>()) {
#if KJ_HAS_COMPILER_FEATURE(cxx_constexpr_string_builtins)
      int ret = __builtin_memcmp(ptr, other.ptr, comparisonSize * sizeof(T));
      if (ret != 0) {
        return ret < 0;
      }
#else
      for (size_t i = 0; i < comparisonSize; ++i) {
        if (static_cast<unsigned char>(ptr[i]) != static_cast<unsigned char>(other.ptr[i])) {
          return static_cast<unsigned char>(ptr[i]) < static_cast<unsigned char>(other.ptr[i]);
        }
      }
#endif
    } else {
      for (size_t i = 0; i < comparisonSize; i++) {
        bool ret = ptr[i] == other.ptr[i];
        if (!ret) {
          return ptr[i] < other.ptr[i];
        }
      }
    }
    // arrays are equal up to comparisonSize
    return size_ < other.size_;
  }